

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx512f.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx512bw>::weight_from_sin
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx512bw> *this,
          PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined4 uVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  undefined8 uVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  batch *in_RAX;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 in_ZMM0 [64];
  
  uVar1 = *(undefined4 *)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  auVar11._32_4_ = uVar1;
  auVar11._36_4_ = uVar1;
  auVar11._40_4_ = uVar1;
  auVar11._44_4_ = uVar1;
  auVar11._48_4_ = uVar1;
  auVar11._52_4_ = uVar1;
  auVar11._56_4_ = uVar1;
  auVar11._60_4_ = uVar1;
  uVar5 = vcmpps_avx512f(in_ZMM0,auVar11,2);
  if ((short)uVar5 == -1) {
    vbroadcastss_avx512f(ZEXT416(0x3f800000));
    return in_RAX;
  }
  auVar11 = vbroadcastss_avx512f
                      (ZEXT416(*(uint *)((long)&this[0x10].super_PolarExtentCore.
                                                _vptr_PolarExtentCore + 4)));
  uVar5 = vcmpps_avx512f(auVar11,in_ZMM0,2);
  if ((short)uVar5 != -1) {
    auVar12._8_4_ = 0x7fffffff;
    auVar12._0_8_ = 0x7fffffff7fffffff;
    auVar12._12_4_ = 0x7fffffff;
    auVar12._16_4_ = 0x7fffffff;
    auVar12._20_4_ = 0x7fffffff;
    auVar12._24_4_ = 0x7fffffff;
    auVar12._28_4_ = 0x7fffffff;
    auVar12._32_4_ = 0x7fffffff;
    auVar12._36_4_ = 0x7fffffff;
    auVar12._40_4_ = 0x7fffffff;
    auVar12._44_4_ = 0x7fffffff;
    auVar12._48_4_ = 0x7fffffff;
    auVar12._52_4_ = 0x7fffffff;
    auVar12._56_4_ = 0x7fffffff;
    auVar12._60_4_ = 0x7fffffff;
    auVar12 = vandpd_avx512dq(in_ZMM0,auVar12);
    auVar13 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    uVar6 = vcmpps_avx512f(auVar13,auVar12,1);
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar14 = vsubps_avx512f(auVar14,auVar12);
    auVar15 = vmulps_avx512f(auVar12,auVar12);
    auVar13 = vmulps_avx512f(auVar14,auVar13);
    bVar2 = (byte)uVar6;
    auVar16._0_4_ = (uint)(bVar2 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar15._0_4_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar16._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar15._4_4_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar16._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar15._8_4_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar16._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar15._12_4_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar16._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar15._16_4_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar16._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar15._20_4_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar16._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar15._24_4_;
    bVar3 = (bool)((byte)(uVar6 >> 7) & 1);
    auVar16._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar15._28_4_;
    bVar4 = (byte)(uVar6 >> 8);
    auVar16._32_4_ = (uint)(bVar4 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._32_4_;
    bVar3 = (bool)((byte)(uVar6 >> 9) & 1);
    auVar16._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar15._36_4_;
    bVar3 = (bool)((byte)(uVar6 >> 10) & 1);
    auVar16._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar15._40_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xb) & 1);
    auVar16._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar15._44_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xc) & 1);
    auVar16._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar15._48_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xd) & 1);
    auVar16._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar15._52_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xe) & 1);
    auVar16._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar15._56_4_;
    bVar3 = SUB81(uVar6 >> 0xf,0);
    auVar16._60_4_ = (uint)bVar3 * auVar13._60_4_ | (uint)!bVar3 * auVar15._60_4_;
    auVar13 = vsqrtps_avx512f(auVar16);
    auVar17._0_4_ = (uint)(bVar2 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar12._0_4_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar12._4_4_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar12._8_4_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar12._12_4_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar12._16_4_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar12._20_4_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar12._24_4_;
    bVar3 = (bool)((byte)(uVar6 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar12._28_4_;
    auVar17._32_4_ = (uint)(bVar4 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar12._32_4_;
    bVar3 = (bool)((byte)(uVar6 >> 9) & 1);
    auVar17._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar12._36_4_;
    bVar3 = (bool)((byte)(uVar6 >> 10) & 1);
    auVar17._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar12._40_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xb) & 1);
    auVar17._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar12._44_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xc) & 1);
    auVar17._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar12._48_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xd) & 1);
    auVar17._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar12._52_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xe) & 1);
    auVar17._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar12._56_4_;
    bVar3 = SUB81(uVar6 >> 0xf,0);
    auVar17._60_4_ = (uint)bVar3 * auVar13._60_4_ | (uint)!bVar3 * auVar12._60_4_;
    auVar12 = vbroadcastss_avx512f(ZEXT416(0x3d2cb352));
    auVar13._8_4_ = 0x3cc617e3;
    auVar13._0_8_ = 0x3cc617e33cc617e3;
    auVar13._12_4_ = 0x3cc617e3;
    auVar13._16_4_ = 0x3cc617e3;
    auVar13._20_4_ = 0x3cc617e3;
    auVar13._24_4_ = 0x3cc617e3;
    auVar13._28_4_ = 0x3cc617e3;
    auVar13._32_4_ = 0x3cc617e3;
    auVar13._36_4_ = 0x3cc617e3;
    auVar13._40_4_ = 0x3cc617e3;
    auVar13._44_4_ = 0x3cc617e3;
    auVar13._48_4_ = 0x3cc617e3;
    auVar13._52_4_ = 0x3cc617e3;
    auVar13._56_4_ = 0x3cc617e3;
    auVar13._60_4_ = 0x3cc617e3;
    auVar12 = vfmadd213ps_avx512f(auVar12,auVar16,auVar13);
    auVar14._8_4_ = 0x3d3a3ec7;
    auVar14._0_8_ = 0x3d3a3ec73d3a3ec7;
    auVar14._12_4_ = 0x3d3a3ec7;
    auVar14._16_4_ = 0x3d3a3ec7;
    auVar14._20_4_ = 0x3d3a3ec7;
    auVar14._24_4_ = 0x3d3a3ec7;
    auVar14._28_4_ = 0x3d3a3ec7;
    auVar14._32_4_ = 0x3d3a3ec7;
    auVar14._36_4_ = 0x3d3a3ec7;
    auVar14._40_4_ = 0x3d3a3ec7;
    auVar14._44_4_ = 0x3d3a3ec7;
    auVar14._48_4_ = 0x3d3a3ec7;
    auVar14._52_4_ = 0x3d3a3ec7;
    auVar14._56_4_ = 0x3d3a3ec7;
    auVar14._60_4_ = 0x3d3a3ec7;
    auVar12 = vfmadd213ps_avx512f(auVar12,auVar16,auVar14);
    auVar15._8_4_ = 0x3d9980f6;
    auVar15._0_8_ = 0x3d9980f63d9980f6;
    auVar15._12_4_ = 0x3d9980f6;
    auVar15._16_4_ = 0x3d9980f6;
    auVar15._20_4_ = 0x3d9980f6;
    auVar15._24_4_ = 0x3d9980f6;
    auVar15._28_4_ = 0x3d9980f6;
    auVar15._32_4_ = 0x3d9980f6;
    auVar15._36_4_ = 0x3d9980f6;
    auVar15._40_4_ = 0x3d9980f6;
    auVar15._44_4_ = 0x3d9980f6;
    auVar15._48_4_ = 0x3d9980f6;
    auVar15._52_4_ = 0x3d9980f6;
    auVar15._56_4_ = 0x3d9980f6;
    auVar15._60_4_ = 0x3d9980f6;
    auVar12 = vfmadd213ps_avx512f(auVar12,auVar16,auVar15);
    auVar7._8_4_ = 0x3e2aaae4;
    auVar7._0_8_ = 0x3e2aaae43e2aaae4;
    auVar7._12_4_ = 0x3e2aaae4;
    auVar7._16_4_ = 0x3e2aaae4;
    auVar7._20_4_ = 0x3e2aaae4;
    auVar7._24_4_ = 0x3e2aaae4;
    auVar7._28_4_ = 0x3e2aaae4;
    auVar7._32_4_ = 0x3e2aaae4;
    auVar7._36_4_ = 0x3e2aaae4;
    auVar7._40_4_ = 0x3e2aaae4;
    auVar7._44_4_ = 0x3e2aaae4;
    auVar7._48_4_ = 0x3e2aaae4;
    auVar7._52_4_ = 0x3e2aaae4;
    auVar7._56_4_ = 0x3e2aaae4;
    auVar7._60_4_ = 0x3e2aaae4;
    auVar12 = vfmadd213ps_avx512f(auVar12,auVar16,auVar7);
    auVar13 = vmulps_avx512f(auVar16,auVar17);
    auVar12 = vfmadd213ps_avx512f(auVar13,auVar12,auVar17);
    auVar13 = vaddps_avx512f(auVar12,auVar12);
    auVar14 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
    auVar13 = vsubps_avx512f(auVar14,auVar13);
    auVar18._0_4_ = (uint)(bVar2 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar2 & 1) * auVar12._0_4_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * auVar12._4_4_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * auVar12._8_4_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * auVar12._12_4_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * auVar12._16_4_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * auVar12._20_4_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * auVar12._24_4_;
    bVar3 = (bool)((byte)(uVar6 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * auVar12._28_4_;
    auVar18._32_4_ = (uint)(bVar4 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar12._32_4_;
    bVar3 = (bool)((byte)(uVar6 >> 9) & 1);
    auVar18._36_4_ = (uint)bVar3 * auVar13._36_4_ | (uint)!bVar3 * auVar12._36_4_;
    bVar3 = (bool)((byte)(uVar6 >> 10) & 1);
    auVar18._40_4_ = (uint)bVar3 * auVar13._40_4_ | (uint)!bVar3 * auVar12._40_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xb) & 1);
    auVar18._44_4_ = (uint)bVar3 * auVar13._44_4_ | (uint)!bVar3 * auVar12._44_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xc) & 1);
    auVar18._48_4_ = (uint)bVar3 * auVar13._48_4_ | (uint)!bVar3 * auVar12._48_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xd) & 1);
    auVar18._52_4_ = (uint)bVar3 * auVar13._52_4_ | (uint)!bVar3 * auVar12._52_4_;
    bVar3 = (bool)((byte)(uVar6 >> 0xe) & 1);
    auVar18._56_4_ = (uint)bVar3 * auVar13._56_4_ | (uint)!bVar3 * auVar12._56_4_;
    bVar3 = SUB81(uVar6 >> 0xf,0);
    auVar18._60_4_ = (uint)bVar3 * auVar13._60_4_ | (uint)!bVar3 * auVar12._60_4_;
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar8._16_4_ = 0x80000000;
    auVar8._20_4_ = 0x80000000;
    auVar8._24_4_ = 0x80000000;
    auVar8._28_4_ = 0x80000000;
    auVar8._32_4_ = 0x80000000;
    auVar8._36_4_ = 0x80000000;
    auVar8._40_4_ = 0x80000000;
    auVar8._44_4_ = 0x80000000;
    auVar8._48_4_ = 0x80000000;
    auVar8._52_4_ = 0x80000000;
    auVar8._56_4_ = 0x80000000;
    auVar8._60_4_ = 0x80000000;
    auVar12 = vpternlogq_avx512f(auVar18,in_ZMM0,auVar8,0x78);
    uVar1 = *(undefined4 *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
    auVar9._4_4_ = uVar1;
    auVar9._0_4_ = uVar1;
    auVar9._8_4_ = uVar1;
    auVar9._12_4_ = uVar1;
    auVar9._16_4_ = uVar1;
    auVar9._20_4_ = uVar1;
    auVar9._24_4_ = uVar1;
    auVar9._28_4_ = uVar1;
    auVar9._32_4_ = uVar1;
    auVar9._36_4_ = uVar1;
    auVar9._40_4_ = uVar1;
    auVar9._44_4_ = uVar1;
    auVar9._48_4_ = uVar1;
    auVar9._52_4_ = uVar1;
    auVar9._56_4_ = uVar1;
    auVar9._60_4_ = uVar1;
    auVar12 = vmulps_avx512f(auVar12,auVar9);
    vcmpps_avx512f(auVar11,in_ZMM0,6);
    uVar1 = *(undefined4 *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar10._4_4_ = uVar1;
    auVar10._0_4_ = uVar1;
    auVar10._8_4_ = uVar1;
    auVar10._12_4_ = uVar1;
    auVar10._16_4_ = uVar1;
    auVar10._20_4_ = uVar1;
    auVar10._24_4_ = uVar1;
    auVar10._28_4_ = uVar1;
    auVar10._32_4_ = uVar1;
    auVar10._36_4_ = uVar1;
    auVar10._40_4_ = uVar1;
    auVar10._44_4_ = uVar1;
    auVar10._48_4_ = uVar1;
    auVar10._52_4_ = uVar1;
    auVar10._56_4_ = uVar1;
    auVar10._60_4_ = uVar1;
    vaddps_avx512f(auVar12,auVar10);
    return in_RAX;
  }
  return in_RAX;
}

Assistant:

inline batch_bool<float, A> le(batch<float, A> const& self, batch<float, A> const& other, requires_arch<avx512f>) noexcept
        {
            return _mm512_cmp_ps_mask(self, other, _CMP_LE_OQ);
        }